

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_hashtbl_test.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  uo_strhashtbl *hashtbl;
  uo_strkvp_linklist *puVar7;
  char *pcVar8;
  char *pcVar9;
  void *pvVar10;
  byte bVar11;
  uo_strhashtbl *puVar12;
  size_t i;
  size_t sVar13;
  size_t i_2;
  size_t i_1;
  long lVar14;
  size_t sVar15;
  bool bVar16;
  
  sVar13 = 0;
  hashtbl = uo_strhashtbl_create(0);
  uo_strhashtbl_set(hashtbl,"key1","value1");
  sVar15 = hashtbl->count;
  puVar7 = uo_strhashtbl_find_link(hashtbl->links,hashtbl->capacity,"key1");
  pcVar9 = (char *)(puVar7->item).value;
  pcVar8 = (char *)uo_strhashtbl_remove(hashtbl,"key1");
  sVar3 = hashtbl->count;
  puVar7 = uo_strhashtbl_find_link(hashtbl->links,hashtbl->capacity,"key1");
  bVar16 = (((pcVar8 == "value1" && sVar15 == 1) && pcVar9 == "value1") && sVar3 == 0) &&
           (puVar7->item).value == (void *)0x0;
  do {
    bVar16 = (bool)(bVar16 & sVar13 == hashtbl->count);
    uo_strhashtbl_set(hashtbl,lorem + sVar13,lorem + sVar13);
    pcVar9 = lorem;
    sVar13 = sVar13 + 1;
  } while (sVar13 != 0x1000);
  bVar11 = bVar16 & hashtbl->count == 0x1000;
  lVar14 = 0;
  puVar12 = hashtbl;
  do {
    puVar12 = (uo_strhashtbl *)(puVar12->head).next;
    iVar6 = strcmp((char *)puVar12->removed_count,pcVar9 + lVar14);
    bVar11 = bVar11 & iVar6 == 0;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x1000);
  lVar14 = 0;
  do {
    pcVar9 = (char *)uo_strhashtbl_remove(hashtbl,lorem + lVar14);
    pcVar8 = lorem + lVar14;
    bVar11 = bVar11 & pcVar8 == pcVar9;
    uo_strhashtbl_set(hashtbl,pcVar8,pcVar8);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x1000);
  sVar15 = 0x1000;
  lVar14 = 0;
  do {
    sVar3 = hashtbl->count;
    pcVar8 = (char *)uo_strhashtbl_remove(hashtbl,lorem + lVar14);
    pcVar9 = lorem;
    bVar11 = bVar11 & (lorem + lVar14 == pcVar8 && sVar3 == sVar15);
    lVar14 = lVar14 + 1;
    sVar15 = sVar15 - 1;
  } while (lVar14 != 0xf00);
  lVar14 = 0x100;
  puVar12 = hashtbl;
  do {
    puVar12 = (uo_strhashtbl *)(puVar12->head).prev;
    lVar14 = lVar14 + -1;
  } while (lVar14 != 0);
  bVar11 = bVar11 & hashtbl->count == 0x100;
  lVar14 = 0;
  do {
    iVar6 = strcmp((char *)puVar12->removed_count,pcVar9 + lVar14 + 0xf00);
    bVar11 = bVar11 & iVar6 == 0;
    puVar12 = (uo_strhashtbl *)(puVar12->head).next;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xff);
  puVar7 = uo_strhashtbl_find_link(hashtbl->links,hashtbl->capacity,"");
  pvVar4 = (puVar7->item).value;
  pvVar10 = uo_strhashtbl_remove(hashtbl,"");
  uo_strhashtbl_set(hashtbl,"","");
  puVar7 = uo_strhashtbl_find_link(hashtbl->links,hashtbl->capacity,"");
  cVar1 = *(puVar7->item).value;
  pcVar9 = (char *)uo_strhashtbl_remove(hashtbl,"");
  cVar2 = *pcVar9;
  puVar7 = uo_strhashtbl_find_link(hashtbl->links,hashtbl->capacity,"");
  pvVar5 = (puVar7->item).value;
  free(hashtbl->links);
  free(hashtbl);
  return (int)(byte)(bVar11 & ((pvVar5 == (void *)0x0 &&
                               (pvVar10 == (void *)0x0 && pvVar4 == (void *)0x0)) &&
                              (cVar1 == '\0' && cVar2 == '\0')) ^ 1);
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_strhashtbl *hashtbl = uo_strhashtbl_create(0);
    const char *key1 = "key1";
    const char *value1 = "value1";
    uo_strhashtbl_set(hashtbl, key1, value1);
    passed &= hashtbl->count == 1;
    passed &= uo_strhashtbl_get(hashtbl, key1) == value1;
    passed &= uo_strhashtbl_remove(hashtbl, key1) == value1;
    passed &= hashtbl->count == 0;
    passed &= uo_strhashtbl_get(hashtbl, key1) == NULL;

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= hashtbl->count == i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    passed &= hashtbl->count == 0x1000;

    uo_strkvp_linklist *link = uo_strhashtbl_list(hashtbl);
    for (size_t i = 0; i < 0x1000; ++i)
    {
        link = uo_strkvp_linklist_next(link);
        passed &= strcmp(link->item.value, lorem + i) == 0;
    }

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    for (size_t i = 0; i < (0x1000 - 0x100); ++i)
    {
        passed &= hashtbl->count == 0x1000 - i;
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
    }

    passed &= hashtbl->count == 0x100;

    link = uo_strhashtbl_list(hashtbl);

    for (size_t i = 0; i < 0x100; ++i)
        link = uo_strkvp_linklist_prev(link);

    for (size_t i = (0x1000 - 0x100); i < 0x1000 - 1; ++i)
    {
        passed &= strcmp(link->item.value, lorem + i) == 0;
        link = uo_strkvp_linklist_next(link);
    }

    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;
    passed &= uo_strhashtbl_remove(hashtbl, "") == NULL;
    uo_strhashtbl_set(hashtbl, "", "");
    passed &= strcmp(uo_strhashtbl_get(hashtbl, ""), "") == 0;
    passed &= strcmp(uo_strhashtbl_remove(hashtbl, ""), "") == 0;
    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;

    uo_strhashtbl_destroy(hashtbl);

    return passed ? 0 : 1;
}